

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayTextureSizeRTComputeShader::configureTestSpecificObjects
          (TextureCubeMapArrayTextureSizeRTComputeShader *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  GLuint rt_data [4];
  undefined8 local_38;
  undefined8 uStack_30;
  long lVar3;
  
  TextureCubeMapArrayTextureSizeRTBase::configureTestSpecificObjects
            (&this->super_TextureCubeMapArrayTextureSizeRTBase);
  iVar1 = (*((this->super_TextureCubeMapArrayTextureSizeRTBase).
             super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  local_38 = 0;
  uStack_30 = 0;
  (**(code **)(lVar3 + 0x6f8))(1,&this->m_rt_img_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error generating texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x600);
  (**(code **)(lVar3 + 8))(0x84c2);
  (**(code **)(lVar3 + 0xb8))(0xde1,this->m_rt_img_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error binding texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x604);
  (**(code **)(lVar3 + 0x1380))(0xde1,1,0x8d70,1,1);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error allocating storage for texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x607);
  (**(code **)(lVar3 + 0x13b8))(0xde1,0,0,0,1,1,0x8d99,0x1405,&local_38);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error filling texture object\'s data store with data!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x60a);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x2800,0x2600);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error setting texture object\'s filter mode!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x60d);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x2801,0x2600);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error setting texture object\'s filter mode!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x60f);
  (**(code **)(lVar3 + 0x80))
            (1,(this->super_TextureCubeMapArrayTextureSizeRTBase).m_rt_std_id,0,0,0,0x88b9,0x8d70);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error binding texture object to image unit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x613);
  (**(code **)(lVar3 + 0x80))
            (2,(this->super_TextureCubeMapArrayTextureSizeRTBase).m_rt_shw_id,0,0,0,0x88b9,0x8d70);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error binding texture object to image unit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x615);
  (**(code **)(lVar3 + 0x80))(3,this->m_rt_img_id,0,0,0,0x88b9,0x8d70);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Error binding texture object to image unit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageTextureSize.cpp"
                  ,0x617);
  return;
}

Assistant:

void TextureCubeMapArrayTextureSizeRTComputeShader::configureTestSpecificObjects(void)
{
	TextureCubeMapArrayTextureSizeRTBase::configureTestSpecificObjects();

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint rt_data[m_n_rt_components];
	memset(rt_data, 0, m_n_rt_components * sizeof(glw::GLuint));

	/* Create texture which will store result of imageSize() for imageCubeArray image */
	gl.genTextures(1, &m_rt_img_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating texture object!");

	gl.activeTexture(GL_TEXTURE2);
	gl.bindTexture(GL_TEXTURE_2D, m_rt_img_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object!");

	gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA32UI, 1, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating storage for texture object!");

	gl.texSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 1, 1, GL_RGBA_INTEGER, GL_UNSIGNED_INT, rt_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error filling texture object's data store with data!");

	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting texture object's filter mode!");
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting texture object's filter mode!");

	/* Image unit binding start from index 1 for compute shader results */
	gl.bindImageTexture(1, m_rt_std_id, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32UI);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit");
	gl.bindImageTexture(2, m_rt_shw_id, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32UI);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit");
	gl.bindImageTexture(3, m_rt_img_id, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32UI);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding texture object to image unit");
}